

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Reader.cpp
# Opt level: O2

void __thiscall adios2::core::engine::BP5Reader::NotifyEngineNoVarsQuery(BP5Reader *this)

{
  allocator local_8c;
  allocator local_8b;
  allocator local_8a;
  allocator local_89;
  string local_88;
  string local_68;
  string local_48;
  string local_28;
  
  if ((this->super_Engine).m_BetweenStepPairs == false) {
    std::__cxx11::string::string((string *)&local_28,"Engine",&local_89);
    std::__cxx11::string::string((string *)&local_48,"BP5Reader",&local_8a);
    std::__cxx11::string::string((string *)&local_68,"NotifyEngineNoVarsQuery",&local_8b);
    std::__cxx11::string::string
              ((string *)&local_88,
               "You\'ve called InquireVariable() when the IO is empty and outside a BeginStep/EndStep pair.  If this is code that is newly transititioning to the BP5 file engine, you may be relying upon deprecated behaviour.  If you intend to use ADIOS using the Begin/EndStep interface, move all InquireVariable calls inside the BeginStep/EndStep pair.  If intending to use random-access file mode, change your Open() mode parameter to Mode::ReadRandomAccess."
               ,&local_8c);
    helper::Throw<std::logic_error>(&local_28,&local_48,&local_68,&local_88,-1);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_28);
  }
  return;
}

Assistant:

void BP5Reader::NotifyEngineNoVarsQuery()
{
    if (!m_BetweenStepPairs)
    {
        helper::Throw<std::logic_error>(
            "Engine", "BP5Reader", "NotifyEngineNoVarsQuery",
            "You've called InquireVariable() when the IO is empty and "
            "outside a BeginStep/EndStep pair.  If this is code that is "
            "newly "
            "transititioning to the BP5 file engine, you may be relying "
            "upon "
            "deprecated behaviour.  If you intend to use ADIOS using the "
            "Begin/EndStep interface, move all InquireVariable calls "
            "inside "
            "the BeginStep/EndStep pair.  If intending to use "
            "random-access "
            "file mode, change your Open() mode parameter to "
            "Mode::ReadRandomAccess.");
    }
}